

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlParserInputPtr xmlNewEntityInputStream(xmlParserCtxtPtr ctxt,xmlEntityPtr ent)

{
  xmlParserInputPtr pxVar1;
  
  if (ent == (xmlEntityPtr)0x0 || ctxt == (xmlParserCtxtPtr)0x0) {
    return (xmlParserInputPtr)0x0;
  }
  if (ent->content == (xmlChar *)0x0) {
    if (ent->URI == (xmlChar *)0x0) {
      return (xmlParserInputPtr)0x0;
    }
    pxVar1 = xmlLoadResource(ctxt,(char *)ent->URI,(char *)ent->ExternalID,
                             (ent->etype == XML_EXTERNAL_PARAMETER_ENTITY) +
                             XML_RESOURCE_GENERAL_ENTITY);
  }
  else {
    pxVar1 = xmlCtxtNewInputFromString(ctxt,(char *)0x0,(char *)ent->content,(char *)0x0,2);
  }
  if (pxVar1 == (xmlParserInputPtr)0x0) {
    return (xmlParserInputPtr)0x0;
  }
  pxVar1->entity = ent;
  return pxVar1;
}

Assistant:

xmlParserInputPtr
xmlNewEntityInputStream(xmlParserCtxtPtr ctxt, xmlEntityPtr ent) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (ent == NULL))
	return(NULL);

    if (ent->content != NULL) {
        input = xmlCtxtNewInputFromString(ctxt, NULL,
                (const char *) ent->content, NULL, XML_INPUT_BUF_STATIC);
    } else if (ent->URI != NULL) {
        xmlResourceType rtype;

        if (ent->etype == XML_EXTERNAL_PARAMETER_ENTITY)
            rtype = XML_RESOURCE_PARAMETER_ENTITY;
        else
            rtype = XML_RESOURCE_GENERAL_ENTITY;

        input = xmlLoadResource(ctxt, (char *) ent->URI,
                                (char *) ent->ExternalID, rtype);
    } else {
        return(NULL);
    }

    if (input == NULL)
        return(NULL);

    input->entity = ent;

    return(input);
}